

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,bool is_descriptor,
               GeneratorContext *generator_context)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  long lVar3;
  int i_3;
  long lVar4;
  string metadata_filename;
  string fullname;
  Printer printer;
  string metadata_fullname;
  string filename;
  string local_50;
  ZeroCopyOutputStream *output;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x6b) == '\0') {
    GeneratedMessageFileName_abi_cxx11_
              (&filename,(php *)message,(Descriptor *)(ulong)is_descriptor,
               SUB81(generator_context,0));
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    io::Printer::Printer(&printer,output,'^');
    GenerateHead(file,&printer);
    FilenameToClassname(&fullname,&filename);
    iVar2 = std::__cxx11::string::find_last_of((char *)&fullname,0x3430b6);
    if (*(long *)(*(long *)(file + 8) + 8) != 0) {
      std::__cxx11::string::substr((ulong)&metadata_filename,(ulong)&fullname);
      io::Printer::Print(&printer,"namespace ^name^;\n\n","name",&metadata_filename);
      std::__cxx11::string::~string((string *)&metadata_filename);
    }
    GenerateUseDeclaration(is_descriptor,&printer);
    GenerateMessageDocComment(&printer,message);
    if (iVar2 == -1) {
      io::Printer::Print(&printer,"class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n",
                         "name",&fullname);
    }
    else {
      std::__cxx11::string::substr((ulong)&metadata_filename,(ulong)&fullname);
      io::Printer::Print(&printer,"class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n",
                         "name",&metadata_filename);
      std::__cxx11::string::~string((string *)&metadata_filename);
    }
    Indent(&printer);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x2c); lVar3 = lVar3 + 1) {
      GenerateField((FieldDescriptor *)(*(long *)(message + 0x30) + lVar4),&printer,is_descriptor);
      lVar4 = lVar4 + 0xa8;
    }
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x38); lVar3 = lVar3 + 1) {
      GenerateOneofField((OneofDescriptor *)(*(long *)(message + 0x40) + lVar4),&printer);
      lVar4 = lVar4 + 0x30;
    }
    io::Printer::Print(&printer,"\n");
    io::Printer::Print(&printer,"public function __construct() {\n");
    Indent(&printer);
    GeneratedMetadataFileName(&metadata_filename,*(string **)file,is_descriptor);
    FilenameToClassname(&metadata_fullname,&metadata_filename);
    io::Printer::Print(&printer,"\\^fullname^::initOnce();\nparent::__construct();\n","fullname",
                       &metadata_fullname);
    Outdent(&printer);
    io::Printer::Print(&printer,"}\n\n");
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x2c); lVar3 = lVar3 + 1) {
      GenerateFieldAccessor
                ((FieldDescriptor *)(*(long *)(message + 0x30) + lVar4),is_descriptor,&printer);
      lVar4 = lVar4 + 0xa8;
    }
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(message + 0x38); lVar3 = lVar3 + 1) {
      lVar1 = *(long *)(message + 0x40);
      UnderscoresToCamelCase(&local_50,*(string **)(lVar1 + lVar4),true);
      io::Printer::Print(&printer,
                         "public function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                         ,"camel_name",&local_50,"name",*(string **)(lVar1 + lVar4));
      std::__cxx11::string::~string((string *)&local_50);
      lVar4 = lVar4 + 0x30;
    }
    Outdent(&printer);
    io::Printer::Print(&printer,"}\n\n");
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(message + 0x48); lVar4 = lVar4 + 1) {
      GenerateMessageFile(file,(Descriptor *)(*(long *)(message + 0x50) + lVar3),is_descriptor,
                          generator_context);
      lVar3 = lVar3 + 0xa8;
    }
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(message + 0x58); lVar4 = lVar4 + 1) {
      GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(message + 0x60) + lVar3),is_descriptor,
                       generator_context);
      lVar3 = lVar3 + 0x38;
    }
    std::__cxx11::string::~string((string *)&metadata_fullname);
    std::__cxx11::string::~string((string *)&metadata_filename);
    std::__cxx11::string::~string((string *)&fullname);
    io::Printer::~Printer(&printer);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])();
    }
    std::__cxx11::string::~string((string *)&filename);
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         bool is_descriptor,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedMessageFileName(message, is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->package().empty()) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(is_descriptor, &printer);

  GenerateMessageDocComment(&printer, message);
  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, is_descriptor);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  printer.Print(
      "public function __construct() {\n");
  Indent(&printer);

  std::string metadata_filename =
      GeneratedMetadataFileName(file->name(), is_descriptor);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n"
      "parent::__construct();\n",
      "fullname", metadata_fullname);

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, is_descriptor, &printer);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), is_descriptor,
                     generator_context);
  }
}